

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_face(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT node;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [27];
  REF_INT nodes [27];
  REF_INT local_34;
  REF_CELL pRStack_30;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT new_node_local;
  REF_INT node2_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRStack_30 = ref_grid->cell[8];
  cell1 = node0;
  cell0 = node1;
  face_nodes[0] = node2;
  face_nodes[1] = node0;
  ref_cell._0_4_ = new_node;
  ref_cell._4_4_ = node2;
  new_node_local = node1;
  node2_local = node0;
  _node1_local = ref_grid;
  uVar1 = ref_cell_with_face(pRStack_30,&cell1,&node,&new_cell);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e4,
           "ref_split_face",(ulong)uVar1,"get tet(2)");
    return uVar1;
  }
  if (node != -1) {
    local_34 = node;
    uVar1 = ref_cell_nodes(pRStack_30,node,face_nodes + 0x1a);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e7
             ,"ref_split_face",(ulong)uVar1,"cell nodes");
      return uVar1;
    }
    uVar1 = ref_cell_remove(pRStack_30,local_34);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e8
             ,"ref_split_face",(ulong)uVar1,"remove");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (node2_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1ec
             ,"ref_split_face",(ulong)uVar1,"add node0 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = node2_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (new_node_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1f2
             ,"ref_split_face",(ulong)uVar1,"add node1 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = new_node_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (ref_cell._4_4_ == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1f8
             ,"ref_split_face",(ulong)uVar1,"add node2 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = ref_cell._4_4_;
      }
    }
  }
  if (new_cell != -1) {
    local_34 = new_cell;
    uVar1 = ref_cell_nodes(pRStack_30,new_cell,face_nodes + 0x1a);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1fe
             ,"ref_split_face",(ulong)uVar1,"cell nodes");
      return uVar1;
    }
    uVar1 = ref_cell_remove(pRStack_30,local_34);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1ff
             ,"ref_split_face",(ulong)uVar1,"remove");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (node2_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x203
             ,"ref_split_face",(ulong)uVar1,"add node0 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = node2_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (new_node_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x209
             ,"ref_split_face",(ulong)uVar1,"add node1 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = new_node_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (ref_cell._4_4_ == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x20f
             ,"ref_split_face",(ulong)uVar1,"add node2 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = ref_cell._4_4_;
      }
    }
  }
  pRStack_30 = _node1_local->cell[3];
  uVar1 = ref_cell_with(pRStack_30,&cell1,&local_34);
  if ((uVar1 != 0) && (uVar1 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x215,
           "ref_split_face",(ulong)uVar1,"find tri");
    return uVar1;
  }
  if (local_34 != -1) {
    uVar1 = ref_cell_nodes(pRStack_30,local_34,face_nodes + 0x1a);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x217
             ,"ref_split_face",(ulong)uVar1,"cell nodes");
      return uVar1;
    }
    uVar1 = ref_cell_remove(pRStack_30,local_34);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x218
             ,"ref_split_face",(ulong)uVar1,"remove");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (node2_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x21c
             ,"ref_split_face",(ulong)uVar1,"add node0 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = node2_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (new_node_local == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x222
             ,"ref_split_face",(ulong)uVar1,"add node1 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = new_node_local;
      }
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (ref_cell._4_4_ == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = (REF_INT)ref_cell;
      }
    }
    uVar1 = ref_cell_add(pRStack_30,face_nodes + 0x1a,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x228
             ,"ref_split_face",(ulong)uVar1,"add node2 version");
      return uVar1;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_30->node_per;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((REF_INT)ref_cell == face_nodes[(long)ref_private_macro_code_rss + 0x1a]) {
        face_nodes[(long)ref_private_macro_code_rss + 0x1a] = ref_cell._4_4_;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_face(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT node2,
                                  REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell0, cell1;
  REF_INT node, new_cell;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "get tet(2)");
  if (REF_EMPTY != cell0) {
    cell = cell0;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }
  if (REF_EMPTY != cell1) {
    cell = cell1;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  ref_cell = ref_grid_tri(ref_grid);
  RXS(ref_cell_with(ref_cell, face_nodes, &cell), REF_NOT_FOUND, "find tri");
  if (REF_EMPTY != cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  return REF_SUCCESS;
}